

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::CoverCrossSyntax::CoverCrossSyntax
          (CoverCrossSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          NamedLabelSyntax *label,Token cross,
          SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *items,
          CoverageIffClauseSyntax *iff,Token openBrace,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token closeBrace,Token emptySemi)

{
  size_t sVar1;
  pointer ppAVar2;
  pointer ppMVar3;
  SyntaxNode *pSVar4;
  undefined4 uVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar7 = cross._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = CoverCross;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2a10;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar8 = 0;
    do {
      *(CoverCrossSyntax **)(*(long *)((long)ppAVar2 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  this->label = label;
  (this->cross).kind = (short)uVar7;
  (this->cross).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->cross).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->cross).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->cross).info = cross.info;
  uVar5 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5d58;
  sVar1 = (items->elements)._M_extent._M_extent_value;
  (this->items).elements._M_ptr = (items->elements)._M_ptr;
  (this->items).elements._M_extent._M_extent_value = sVar1;
  this->iff = iff;
  (this->openBrace).kind = openBrace.kind;
  (this->openBrace).field_0x2 = openBrace._2_1_;
  (this->openBrace).numFlags = (NumericTokenFlags)openBrace.numFlags.raw;
  (this->openBrace).rawLen = openBrace.rawLen;
  (this->openBrace).info = openBrace.info;
  uVar5 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (members->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (members->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar1 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d55d0;
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  (this->closeBrace).info = closeBrace.info;
  (this->emptySemi).kind = emptySemi.kind;
  (this->emptySemi).field_0x2 = emptySemi._2_1_;
  (this->emptySemi).numFlags = (NumericTokenFlags)emptySemi.numFlags.raw;
  (this->emptySemi).rawLen = emptySemi.rawLen;
  (this->emptySemi).info = emptySemi.info;
  if (label != (NamedLabelSyntax *)0x0) {
    (label->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar9 = (this->items).elements._M_extent._M_extent_value + 1;
  if (1 < uVar9) {
    uVar9 = uVar9 >> 1;
    lVar8 = 0;
    do {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      (*ppSVar6)->parent = (SyntaxNode *)this;
      lVar8 = lVar8 + 0x30;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if (this->iff != (CoverageIffClauseSyntax *)0x0) {
    (this->iff->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppMVar3 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar8 = 0;
    do {
      *(CoverCrossSyntax **)(*(long *)((long)ppMVar3 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  return;
}

Assistant:

CoverCrossSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, NamedLabelSyntax* label, Token cross, const SeparatedSyntaxList<IdentifierNameSyntax>& items, CoverageIffClauseSyntax* iff, Token openBrace, const SyntaxList<MemberSyntax>& members, Token closeBrace, Token emptySemi) :
        MemberSyntax(SyntaxKind::CoverCross, attributes), label(label), cross(cross), items(items), iff(iff), openBrace(openBrace), members(members), closeBrace(closeBrace), emptySemi(emptySemi) {
        if (this->label) this->label->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->iff) this->iff->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }